

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * ae_strtofflags(char *s,unsigned_long *setp,unsigned_long *clrp)

{
  int iVar1;
  bool bVar2;
  char *local_50;
  char *failed;
  unsigned_long clear;
  unsigned_long set;
  flag *flag;
  char *end;
  char *start;
  unsigned_long *clrp_local;
  unsigned_long *setp_local;
  char *s_local;
  
  failed = (char *)0x0;
  clear = 0;
  local_50 = (char *)0x0;
  end = s;
  while( true ) {
    bVar2 = true;
    if ((*end != '\t') && (bVar2 = true, *end != ' ')) {
      bVar2 = *end == ',';
    }
    if (!bVar2) break;
    end = end + 1;
  }
  do {
    if (*end == '\0') {
      if (setp != (unsigned_long *)0x0) {
        *setp = clear;
      }
      if (clrp != (unsigned_long *)0x0) {
        *clrp = (unsigned_long)failed;
      }
      return local_50;
    }
    flag = (flag *)end;
    while( true ) {
      bVar2 = false;
      if (((*(char *)&flag->name != '\0') && (bVar2 = false, *(char *)&flag->name != '\t')) &&
         (bVar2 = false, *(char *)&flag->name != ' ')) {
        bVar2 = *(char *)&flag->name != ',';
      }
      if (!bVar2) break;
      flag = (flag *)((long)&flag->name + 1);
    }
    for (set = (unsigned_long)flags; *(long *)set != 0; set = set + 0x20) {
      iVar1 = memcmp(end,*(void **)set,(long)flag - (long)end);
      if (iVar1 == 0) {
        failed = (char *)(*(ulong *)(set + 0x10) | (ulong)failed);
        clear = *(ulong *)(set + 0x18) | clear;
        break;
      }
      iVar1 = memcmp(end,(void *)(*(long *)set + 2),(long)flag - (long)end);
      if (iVar1 == 0) {
        clear = *(ulong *)(set + 0x10) | clear;
        failed = (char *)(*(ulong *)(set + 0x18) | (ulong)failed);
        break;
      }
    }
    if ((*(long *)set == 0) && (local_50 == (char *)0x0)) {
      local_50 = end;
    }
    end = (char *)flag;
    while( true ) {
      bVar2 = true;
      if ((*end != '\t') && (bVar2 = true, *end != ' ')) {
        bVar2 = *end == ',';
      }
      if (!bVar2) break;
      end = end + 1;
    }
  } while( true );
}

Assistant:

static const char *
ae_strtofflags(const char *s, unsigned long *setp, unsigned long *clrp)
{
	const char *start, *end;
	struct flag *flag;
	unsigned long set, clear;
	const char *failed;

	set = clear = 0;
	start = s;
	failed = NULL;
	/* Find start of first token. */
	while (*start == '\t'  ||  *start == ' '  ||  *start == ',')
		start++;
	while (*start != '\0') {
		/* Locate end of token. */
		end = start;
		while (*end != '\0'  &&  *end != '\t'  &&
		    *end != ' '  &&  *end != ',')
			end++;
		for (flag = flags; flag->name != NULL; flag++) {
			if (memcmp(start, flag->name, end - start) == 0) {
				/* Matched "noXXXX", so reverse the sense. */
				clear |= flag->set;
				set |= flag->clear;
				break;
			} else if (memcmp(start, flag->name + 2, end - start)
			    == 0) {
				/* Matched "XXXX", so don't reverse. */
				set |= flag->set;
				clear |= flag->clear;
				break;
			}
		}
		/* Ignore unknown flag names. */
		if (flag->name == NULL  &&  failed == NULL)
			failed = start;

		/* Find start of next token. */
		start = end;
		while (*start == '\t'  ||  *start == ' '  ||  *start == ',')
			start++;

	}

	if (setp)
		*setp = set;
	if (clrp)
		*clrp = clear;

	/* Return location of first failure. */
	return (failed);
}